

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
          (QMovableArrayOps<QUrl> *this,qsizetype i,QUrl *args)

{
  qsizetype *pqVar1;
  QUrl **ppQVar2;
  Data *pDVar3;
  QUrl *pQVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_58;
  QUrl local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size == i) {
      qVar5 = QArrayDataPointer<QUrl>::freeSpaceAtEnd((QArrayDataPointer<QUrl> *)this);
      if (qVar5 == 0) goto LAB_004aa104;
      QUrl::QUrl((this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr +
                 (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size,args);
LAB_004aa1ef:
      pqVar1 = &(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size;
      *pqVar1 = *pqVar1 + 1;
      goto LAB_004aa1ae;
    }
LAB_004aa104:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QUrl>::freeSpaceAtBegin((QArrayDataPointer<QUrl> *)this);
      if (qVar5 != 0) {
        QUrl::QUrl((this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr + -1,args)
        ;
        ppQVar2 = &(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr;
        *ppQVar2 = *ppQVar2 + -1;
        goto LAB_004aa1ef;
      }
    }
  }
  local_30.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_30,args);
  bVar6 = (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size != 0;
  QArrayDataPointer<QUrl>::detachAndGrow
            ((QArrayDataPointer<QUrl> *)this,(uint)(i == 0 && bVar6),1,(QUrl **)0x0,
             (QArrayDataPointer<QUrl> *)0x0);
  if (i == 0 && bVar6) {
    pQVar4 = (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr;
    pQVar4[-1].d = local_30.d;
    (this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.ptr = pQVar4 + -1;
    pqVar1 = &(this->super_QGenericArrayOps<QUrl>).super_QArrayDataPointer<QUrl>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&local_58,(QArrayDataPointer<QUrl> *)this,i,1);
    (local_58.displaceFrom)->d = local_30.d;
    local_58.displaceFrom = local_58.displaceFrom + 1;
    (local_58.data)->size = (local_58.data)->size + local_58.nInserts;
  }
  local_30.d = (QUrlPrivate *)0x0;
  QUrl::~QUrl(&local_30);
LAB_004aa1ae:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }